

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadTriangleMesh(XMLLoader *this,Ref<embree::XML> *xml)

{
  vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
  *pvVar1;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *this_00;
  string *psVar2;
  XML *this_01;
  _Alloc_hider _Var3;
  bool bVar4;
  undefined8 *in_RDX;
  size_t i;
  long lVar5;
  ulong uVar6;
  uchar *in_R8;
  size_t in_R9;
  size_t i_1;
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  *this_02;
  Ref<embree::XML> animation;
  allocator local_a1;
  string local_a0;
  _Alloc_hider local_80;
  undefined1 local_78 [16];
  vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_> triangles;
  _Alloc_hider local_48;
  Ref<embree::SceneGraph::MaterialNode> material;
  
  psVar2 = (string *)*in_RDX;
  local_78._8_8_ = in_RDX;
  std::__cxx11::string::string((string *)&local_a0,"material",(allocator *)&animation);
  XML::child((XML *)&triangles,psVar2);
  loadMaterial((XMLLoader *)&material,xml);
  if (triangles.super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)(*(long *)&(triangles.
                            super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0 + 0x18))();
  }
  std::__cxx11::string::~string((string *)&local_a0);
  local_80._M_p = (pointer)::operator_new(0xd8);
  local_48._M_p = (pointer)material.ptr;
  if (material.ptr != (MaterialNode *)0x0) {
    (*((material.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  _Var3._M_p = local_80._M_p;
  SceneGraph::TriangleMeshNode::TriangleMeshNode
            ((TriangleMeshNode *)local_80._M_p,(Ref<embree::SceneGraph::MaterialNode> *)&local_48,
             (BBox1f)0x3f80000000000000,0);
  (**(code **)(*(long *)_Var3._M_p + 0x10))(_Var3._M_p);
  if ((MaterialNode *)local_48._M_p != (MaterialNode *)0x0) {
    (**(code **)(*(long *)local_48._M_p + 0x18))();
  }
  psVar2 = *(string **)local_78._8_8_;
  std::__cxx11::string::string((string *)&local_a0,"animated_positions",(allocator *)&triangles);
  XML::childOpt((XML *)&animation,psVar2);
  std::__cxx11::string::~string((string *)&local_a0);
  pvVar1 = (vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
            *)(local_80._M_p + 0x70);
  if (animation.ptr == (XML *)0x0) {
    psVar2 = *(string **)local_78._8_8_;
    std::__cxx11::string::string((string *)&triangles,"positions",&local_a1);
    XML::childOpt((XML *)local_78,psVar2);
    loadVec3faArray((avector<Vec3fa> *)&local_a0,(XMLLoader *)xml,(Ref<embree::XML> *)local_78);
    std::
    vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
    ::emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
              (pvVar1,(vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                      &local_a0);
    alignedFree((void *)local_a0.field_2._8_8_);
    local_a0.field_2._8_8_ = (void *)0x0;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_allocated_capacity = 0;
    if ((XML *)local_78._0_8_ != (XML *)0x0) {
      (*((RefCount *)local_78._0_8_)->_vptr_RefCount[3])();
    }
    std::__cxx11::string::~string((string *)&triangles);
    this_01 = *(XML **)local_78._8_8_;
    std::__cxx11::string::string((string *)&local_a0,"positions2",(allocator *)&triangles);
    bVar4 = XML::hasChild(this_01,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    if (bVar4) {
      psVar2 = *(string **)local_78._8_8_;
      std::__cxx11::string::string((string *)&triangles,"positions2",&local_a1);
      XML::childOpt((XML *)local_78,psVar2);
      loadVec3faArray((avector<Vec3fa> *)&local_a0,(XMLLoader *)xml,(Ref<embree::XML> *)local_78);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                (pvVar1,(vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                         *)&local_a0);
      alignedFree((void *)local_a0.field_2._8_8_);
      local_a0.field_2._8_8_ = (void *)0x0;
      local_a0._M_string_length = 0;
      local_a0.field_2._M_allocated_capacity = 0;
      if ((XML *)local_78._0_8_ != (XML *)0x0) {
        (*((RefCount *)local_78._0_8_)->_vptr_RefCount[3])();
      }
      std::__cxx11::string::~string((string *)&triangles);
    }
  }
  else {
    for (uVar6 = 0;
        uVar6 < (ulong)((long)((animation.ptr)->children).
                              super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)((animation.ptr)->children).
                              super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar6 = uVar6 + 1) {
      XML::child((XML *)&triangles,(size_t)animation.ptr);
      loadVec3faArray((avector<Vec3fa> *)&local_a0,(XMLLoader *)xml,(Ref<embree::XML> *)&triangles);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                (pvVar1,(vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                         *)&local_a0);
      alignedFree((void *)local_a0.field_2._8_8_);
      local_a0.field_2._8_8_ = (void *)0x0;
      local_a0._M_string_length = 0;
      local_a0.field_2._M_allocated_capacity = 0;
      if (triangles.super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)&(triangles.
                                super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->field_0 + 0x18))();
      }
    }
  }
  if (animation.ptr != (XML *)0x0) {
    (*((animation.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  psVar2 = *(string **)local_78._8_8_;
  std::__cxx11::string::string((string *)&local_a0,"animated_normals",(allocator *)&animation);
  XML::childOpt((XML *)&triangles,psVar2);
  std::__cxx11::string::~string((string *)&local_a0);
  if (triangles.super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    psVar2 = *(string **)local_78._8_8_;
    std::__cxx11::string::string((string *)&local_a0,"normals",(allocator *)local_78);
    XML::childOpt((XML *)&animation,psVar2);
    std::__cxx11::string::~string((string *)&local_a0);
    if (animation.ptr != (XML *)0x0) {
      loadVec3faArray((avector<Vec3fa> *)&local_a0,(XMLLoader *)xml,&animation);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        this_00 = (vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   *)(local_80._M_p + 0x88);
        for (uVar6 = 0;
            uVar6 < (ulong)((long)*(pointer *)(local_80._M_p + 0x78) -
                            (long)(((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                     *)(local_80._M_p + 0x70))->
                                  super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 5);
            uVar6 = uVar6 + 1) {
          std::
          vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ::push_back(this_00,(value_type *)&local_a0);
        }
      }
      alignedFree((void *)local_a0.field_2._8_8_);
      if (animation.ptr != (XML *)0x0) {
        (*((animation.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
    }
    if (triangles.super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>._M_impl
        .super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_00172929;
  }
  else {
    pvVar1 = (vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
              *)(local_80._M_p + 0x88);
    for (uVar6 = 0;
        uVar6 < (ulong)(*(long *)((long)&triangles.
                                         super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[0xb].field_0 + 4)
                        - *(long *)((long)&triangles.
                                           super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[10].field_0 + 8
                                   ) >> 3); uVar6 = uVar6 + 1) {
      XML::child((XML *)&animation,
                 (size_t)triangles.
                         super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>.
                         _M_impl.super__Vector_impl_data._M_start);
      loadVec3faArray((avector<Vec3fa> *)&local_a0,(XMLLoader *)xml,&animation);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                (pvVar1,(vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                         *)&local_a0);
      alignedFree((void *)local_a0.field_2._8_8_);
      local_a0.field_2._8_8_ = (void *)0x0;
      local_a0._M_string_length = 0;
      local_a0.field_2._M_allocated_capacity = 0;
      if (animation.ptr != (XML *)0x0) {
        (*((animation.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
    }
  }
  (**(code **)(*(long *)&(triangles.
                          super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_0 + 0x18))
            (triangles.super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
LAB_00172929:
  psVar2 = *(string **)local_78._8_8_;
  std::__cxx11::string::string((string *)&local_a0,"texcoords",(allocator *)local_78);
  XML::childOpt((XML *)&animation,psVar2);
  loadVec2fArray((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)&triangles,
                 (XMLLoader *)xml,&animation);
  std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::_M_move_assign
            ((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
             (local_80._M_p + 0xa0),
             (_Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)&triangles)
  ;
  std::_Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::~_Vector_base
            ((_Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)&triangles)
  ;
  if (animation.ptr != (XML *)0x0) {
    (*((animation.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string((string *)&local_a0);
  psVar2 = *(string **)local_78._8_8_;
  std::__cxx11::string::string((string *)&local_a0,"triangles",(allocator *)local_78);
  XML::childOpt((XML *)&animation,psVar2);
  loadVec3iArray(&triangles,(XMLLoader *)xml,&animation);
  if (animation.ptr != (XML *)0x0) {
    (*((animation.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string((string *)&local_a0);
  this_02 = (vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
             *)(local_80._M_p + 0xb8);
  lVar5 = 8;
  uVar6 = 0;
  while( true ) {
    _Var3._M_p = local_80._M_p;
    if ((ulong)(((long)triangles.
                       super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)triangles.
                      super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0xc) <= uVar6) break;
    local_a0._M_dataplus._M_p =
         *(pointer *)
          ((long)triangles.
                 super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar5 + -8);
    local_a0._M_string_length =
         CONCAT44(local_a0._M_string_length._4_4_,
                  *(undefined4 *)
                   ((long)&(triangles.
                            super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar5));
    xml = (Ref<embree::XML> *)&local_a0;
    std::
    vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
    ::emplace_back<embree::SceneGraph::TriangleMeshNode::Triangle>(this_02,(Triangle *)&local_a0);
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0xc;
  }
  SceneGraph::TriangleMeshNode::verify
            ((TriangleMeshNode *)local_80._M_p,(EVP_PKEY_CTX *)xml,
             (uchar *)(((long)triangles.
                              super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)triangles.
                             super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) % 0xc),
             (size_t)triangles.
                     super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start,in_R8,in_R9);
  (this->path).filename._M_dataplus._M_p = _Var3._M_p;
  (**(code **)(*(long *)_Var3._M_p + 0x10))(_Var3._M_p);
  std::_Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>::~_Vector_base
            (&triangles.super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>);
  (**(code **)(*(long *)_Var3._M_p + 0x18))(_Var3._M_p);
  if (material.ptr != (MaterialNode *)0x0) {
    (*((material.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadTriangleMesh(const Ref<XML>& xml) 
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    Ref<SceneGraph::TriangleMeshNode> mesh = new SceneGraph::TriangleMeshNode(material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->positions.push_back(loadVec3faArray(animation->child(i)));
    } else {
      mesh->positions.push_back(loadVec3faArray(xml->childOpt("positions")));
      if (xml->hasChild("positions2")) 
        mesh->positions.push_back(loadVec3faArray(xml->childOpt("positions2")));
    }

    if (Ref<XML> animation = xml->childOpt("animated_normals")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->normals.push_back(loadVec3faArray(animation->child(i)));
    }
    else if (Ref<XML> normalbuf = xml->childOpt("normals")) {
      auto vec = loadVec3faArray(normalbuf);
      if (vec.size())
        for (size_t i=0; i<mesh->numTimeSteps(); i++)
          mesh->normals.push_back(vec);
    }
    
    mesh->texcoords = loadVec2fArray(xml->childOpt("texcoords"));

    std::vector<Vec3i> triangles = loadVec3iArray(xml->childOpt("triangles"));
    for (size_t i=0; i<triangles.size(); i++) 
      mesh->triangles.push_back(SceneGraph::TriangleMeshNode::Triangle(triangles[i].x,triangles[i].y,triangles[i].z));

    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }